

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cpp
# Opt level: O1

void crc32_init(void)

{
  ulong uVar1;
  ulong uVar2;
  int i;
  ulong uVar3;
  int t;
  long lVar4;
  ulong uVar5;
  int iVar6;
  
  if (_tableInitialized == '\0') {
    uVar3 = 0;
    do {
      lVar4 = 0;
      uVar5 = uVar3 & 0xffffffff;
      do {
        iVar6 = 8;
        do {
          uVar1 = uVar5 >> 1;
          uVar2 = uVar5 & 1;
          uVar5 = (ulong)((uint)uVar1 ^ 0x82f63b78);
          if (uVar2 == 0) {
            uVar5 = uVar1;
          }
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
        table[lVar4][uVar3] = (uint32_t)uVar5;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x100);
    _tableInitialized = '\x01';
  }
  return;
}

Assistant:

void crc32_init()
{
	if (_tableInitialized) return;

	for(int i = 0; i < 256; i++) 
	{
		uint32_t res = (uint32_t)i;
		for(int t = 0; t < 16; t++) {
			for (int k = 0; k < 8; k++) res = (res & 1) == 1 ? POLY ^ (res >> 1) : (res >> 1);
			table[t][i] = res;
		}
	}

	_tableInitialized = true;
}